

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIOHelpers.hpp
# Opt level: O0

bool TasGrid::IO::readFlag<TasGrid::IO::mode_ascii_type>(istream *os)

{
  int local_14;
  istream *piStack_10;
  int flag;
  istream *os_local;
  
  piStack_10 = os;
  ::std::istream::operator>>(os,&local_14);
  return local_14 != 0;
}

Assistant:

bool readFlag(std::istream &os){
    if (std::is_same<iomode, mode_ascii_type>::value){
        int flag;
        os >> flag;
        return (flag != 0);
    }else{
        char cflag;
        os.read(&cflag, sizeof(char));
        return (cflag == 'y');
    }
}